

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O2

int __thiscall
sliding_puzzle::SlidingPuzzle::calculateLinearConflict
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *state)

{
  element_type *peVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long *plVar7;
  int iVar8;
  ulong in_R8;
  int i;
  ulong uVar9;
  SlidingPuzzle *pSVar10;
  ulong uVar11;
  SlidingPuzzle *pSVar12;
  int j;
  SlidingPuzzle *pSVar13;
  
  peVar1 = (state->
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  lVar2 = (long)(peVar1->state_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(peVar1->state_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - lVar2) / 0x18;
  uVar9 = 0;
  iVar8 = 0;
  do {
    if (uVar9 == uVar6) {
      return iVar8;
    }
    lVar3 = *(long *)(lVar2 + uVar9 * 0x18);
    pSVar12 = (SlidingPuzzle *)(*(long *)(lVar2 + 8 + uVar9 * 0x18) - lVar3 >> 2);
    for (pSVar13 = (SlidingPuzzle *)0x0; pSVar13 != pSVar12;
        pSVar13 = (SlidingPuzzle *)((long)&(pSVar13->explored_)._M_h._M_buckets + 1)) {
      iVar5 = *(int *)(lVar3 + (long)pSVar13 * 4);
      uVar11 = uVar9;
      if (iVar5 == 0) {
        pSVar10 = (SlidingPuzzle *)((ulong)this & 0xffffffff);
LAB_00107e87:
        plVar7 = (long *)(uVar11 * 0x18 + lVar2);
LAB_00107e8e:
        uVar11 = uVar11 + 1;
        if (uVar11 < uVar6) goto code_r0x00107e96;
        pSVar10 = pSVar13;
        while (pSVar10 = (SlidingPuzzle *)((long)&(pSVar10->explored_)._M_h._M_buckets + 1),
              pSVar10 < pSVar12) {
          if (uVar9 == (in_R8 & 0xffffffff)) {
            iVar5 = *(int *)(lVar3 + (long)pSVar10 * 4) + -1;
            iVar8 = iVar8 + (uint)(iVar5 % puzzle_size < (int)this &&
                                  uVar9 == ((long)iVar5 / (long)puzzle_size & 0xffffffffU));
          }
        }
        goto LAB_00107e7c;
      }
      lVar4 = (long)(iVar5 + -1);
      this = (SlidingPuzzle *)(lVar4 % (long)puzzle_size & 0xffffffff);
      in_R8 = lVar4 / (long)puzzle_size & 0xffffffff;
      pSVar10 = this;
      if (pSVar13 != this || in_R8 != uVar9) goto LAB_00107e87;
LAB_00107e7c:
    }
    uVar9 = uVar9 + 1;
  } while( true );
code_r0x00107e96:
  plVar7 = plVar7 + 3;
  if (pSVar10 == pSVar13) goto code_r0x00107e9f;
  goto LAB_00107e8e;
code_r0x00107e9f:
  iVar5 = *(int *)(*plVar7 + (long)pSVar13 * 4) + -1;
  iVar8 = iVar8 + (uint)(iVar5 / puzzle_size < (int)in_R8 &&
                        pSVar13 == (SlidingPuzzle *)((long)iVar5 % (long)puzzle_size & 0xffffffffU))
  ;
  goto LAB_00107e87;
}

Assistant:

int SlidingPuzzle::calculateLinearConflict(const SlidingPuzzleStatePtr& state)
{
  int linear_conflict = 0;

  int target_location_a[2];
  int target_location_b[2];
  for (int i=0; i<state->state_.size(); ++i)
  {
    for (int j=0; j<state->state_[i].size(); ++j)
    {

      if (state->state_[i][j] != 0)
      {
        target_location_a[0] = (state->state_[i][j]-1)/puzzle_size;
        target_location_a[1] = (state->state_[i][j]-1)%puzzle_size;

        if (i == target_location_a[0] &&
            j == target_location_a[1])
        {
          continue;
        }
      }

      for (int k=i+1; k<state->state_.size(); ++k)
      {
        target_location_b[0] = (state->state_[k][j]-1)/puzzle_size;
        target_location_b[1] = (state->state_[k][j]-1)%puzzle_size;

        if ((target_location_a[1] == j) &&
            (target_location_b[1] == j))
        {
          if (target_location_a[0] > target_location_b[0])
          {
            linear_conflict += 1;
          }
        }
      }

      for (int k=j+1; k<state->state_[i].size(); ++k)
      {
        target_location_b[0] = (state->state_[i][k]-1)/puzzle_size;
        target_location_b[1] = (state->state_[i][k]-1)%puzzle_size;

        if ((target_location_a[0] == i) &&
            (target_location_b[0] == i))
        {
          if (target_location_a[1] > target_location_b[1])
          {
            linear_conflict += 1;
          }
        }
      }

    }
  }
  return linear_conflict;

}